

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O1

int __thiscall FNodeBuilder::MarkLoop(FNodeBuilder *this,DWORD firstseg,int loopnum)

{
  int iVar1;
  FPrivSeg *pFVar2;
  sector_t *psVar3;
  FPrivVert *pFVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  DWORD DVar8;
  double dVar9;
  double dVar10;
  
  pFVar2 = (this->Segs).Array;
  if (pFVar2[firstseg].loopnum == 0) {
    psVar3 = pFVar2[firstseg].frontsector;
    do {
      pFVar2 = (this->Segs).Array;
      pFVar2[firstseg].loopnum = loopnum;
      iVar1 = pFVar2[firstseg].v2;
      pFVar4 = (this->Vertices).Array;
      DVar8 = pFVar4[iVar1].segs;
      dVar9 = c_atan2((double)(pFVar4[iVar1].super_FSimpleVert.y -
                              pFVar4[pFVar2[firstseg].v1].super_FSimpleVert.y),
                      (double)(pFVar4[iVar1].super_FSimpleVert.x -
                              pFVar4[pFVar2[firstseg].v1].super_FSimpleVert.x));
      if (DVar8 == 0xffffffff) {
        firstseg = 0xffffffff;
      }
      else {
        uVar7 = 0xffffffff;
        firstseg = 0xffffffff;
        uVar6 = 0xffffffff;
        do {
          pFVar2 = (this->Segs).Array + DVar8;
          if (pFVar2->frontsector == psVar3) {
            pFVar4 = (this->Vertices).Array;
            dVar10 = c_atan2((double)(pFVar4[pFVar2->v1].super_FSimpleVert.y -
                                     pFVar4[pFVar2->v2].super_FSimpleVert.y),
                             (double)(pFVar4[pFVar2->v1].super_FSimpleVert.x -
                                     pFVar4[pFVar2->v2].super_FSimpleVert.x));
            uVar5 = ((int)(dVar10 * 341782637.7882158) - (int)(dVar9 * 341782637.7882158)) * 2;
            firstseg = uVar7;
            if (uVar5 < uVar6 && uVar5 != 0) {
              firstseg = DVar8;
              uVar6 = uVar5;
              uVar7 = DVar8;
            }
          }
          DVar8 = pFVar2->nextforvert;
        } while (DVar8 != 0xffffffff);
      }
    } while ((firstseg != 0xffffffff) && ((this->Segs).Array[firstseg].loopnum == 0));
    loopnum = loopnum + 1;
  }
  return loopnum;
}

Assistant:

int FNodeBuilder::MarkLoop (DWORD firstseg, int loopnum)
{
	DWORD seg;
	sector_t *sec = Segs[firstseg].frontsector;

	if (Segs[firstseg].loopnum != 0)
	{ // already marked
		return loopnum;
	}

	seg = firstseg;

	do
	{
		FPrivSeg *s1 = &Segs[seg];

		s1->loopnum = loopnum;

		P(Printf ("Mark seg %d (%d,%d)-(%d,%d)\n", seg,
				Vertices[s1->v1].x>>16, Vertices[s1->v1].y>>16,
				Vertices[s1->v2].x>>16, Vertices[s1->v2].y>>16));

		DWORD bestseg = DWORD_MAX;
		DWORD tryseg = Vertices[s1->v2].segs;
		angle_t bestang = ANGLE_MAX;
		angle_t ang1 = PointToAngle (Vertices[s1->v2].x - Vertices[s1->v1].x,
			Vertices[s1->v2].y - Vertices[s1->v1].y);

		while (tryseg != DWORD_MAX)
		{
			FPrivSeg *s2 = &Segs[tryseg];

			if (s2->frontsector == sec)
			{
				angle_t ang2 = PointToAngle (Vertices[s2->v1].x - Vertices[s2->v2].x,
					Vertices[s2->v1].y - Vertices[s2->v2].y);
				angle_t angdiff = ang2 - ang1;

				if (angdiff < bestang && angdiff > 0)
				{
					bestang = angdiff;
					bestseg = tryseg;
				}
			}
			tryseg = s2->nextforvert;
		}

		seg = bestseg;
	} while (seg != DWORD_MAX && Segs[seg].loopnum == 0);

	return loopnum + 1;
}